

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateGetMemSize(char *pName)

{
  int iVar1;
  uint n;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int Num2;
  int Num1;
  char *pPtr2;
  char *pPtr1;
  char *pName_local;
  
  pcVar3 = strchr(pName,0x5f);
  pcVar4 = strchr(pcVar3 + 1,0x5f);
  iVar1 = atoi(pcVar3 + 1);
  n = atoi(pcVar4 + 1);
  iVar2 = Abc_Base2Log(n);
  if (iVar1 + iVar2 < 0x20) {
    return (1 << ((byte)iVar1 & 0x1f)) * n;
  }
  __assert_fail("Num1 + Abc_Base2Log(Num2) < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                ,0x6c4,"int Prs_CreateGetMemSize(char *)");
}

Assistant:

int Prs_CreateGetMemSize( char * pName )
{
    char * pPtr1 = strchr( pName, '_' );
    char * pPtr2 = strchr( pPtr1+1, '_' );
    int Num1 = atoi( pPtr1 + 1 );
    int Num2 = atoi( pPtr2 + 1 );
    assert( Num1 + Abc_Base2Log(Num2) < 32 );
    return (1 << Num1) * Num2;
}